

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cpp
# Opt level: O0

void __thiscall polyscope::PointCloud::buildPickUI(PointCloud *this,size_t localPickID)

{
  bool bVar1;
  pointer pPVar2;
  size_type in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::PointCloudQuantity,_std::default_delete<polyscope::PointCloudQuantity>_>_>
  *x;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::PointCloudQuantity,_std::default_delete<polyscope::PointCloudQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::PointCloudQuantity,_std::default_delete<polyscope::PointCloudQuantity>_>_>_>_>
  *__range1;
  char *in_stack_ffffffffffffff28;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  reference in_stack_ffffffffffffff40;
  float indent_w;
  _Self in_stack_ffffffffffffff48;
  _Self in_stack_ffffffffffffff50;
  int columns_count;
  string local_a0 [8];
  unsigned_long in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  string local_30 [32];
  size_type local_10;
  
  columns_count = (int)((ulong)in_stack_ffffffffffffff50._M_node >> 0x20);
  __lhs = &local_70;
  local_10 = in_RSI;
  std::__cxx11::to_string(in_stack_ffffffffffffff68);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::c_str();
  ImGui::TextUnformatted((char *)in_RDI,in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&local_70);
  ImGui::SameLine((float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0));
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::operator[]((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                *)&in_RDI[0x11]._M_string_length,local_10);
  this_00 = local_a0;
  to_string_abi_cxx11_((vec3 *)localPickID);
  std::__cxx11::string::c_str();
  ImGui::TextUnformatted((char *)in_RDI,(char *)this_00);
  std::__cxx11::string::~string(local_a0);
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Indent((float)((ulong)in_stack_ffffffffffffff40 >> 0x20));
  ImGui::Columns(columns_count,(char *)in_stack_ffffffffffffff48._M_node,
                 SUB81((ulong)in_stack_ffffffffffffff40 >> 0x38,0));
  ImGui::GetWindowWidth();
  ImGui::SetColumnWidth
            ((int)((ulong)in_stack_ffffffffffffff40 >> 0x20),SUB84(in_stack_ffffffffffffff40,0));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::PointCloudQuantity,_std::default_delete<polyscope::PointCloudQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::PointCloudQuantity,_std::default_delete<polyscope::PointCloudQuantity>_>_>_>_>
  ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::PointCloudQuantity,_std::default_delete<polyscope::PointCloudQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::PointCloudQuantity,_std::default_delete<polyscope::PointCloudQuantity>_>_>_>_>
           *)this_00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::PointCloudQuantity,_std::default_delete<polyscope::PointCloudQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::PointCloudQuantity,_std::default_delete<polyscope::PointCloudQuantity>_>_>_>_>
  ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::PointCloudQuantity,_std::default_delete<polyscope::PointCloudQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::PointCloudQuantity,_std::default_delete<polyscope::PointCloudQuantity>_>_>_>_>
         *)this_00);
  while( true ) {
    indent_w = (float)((ulong)in_stack_ffffffffffffff40 >> 0x20);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff50,(_Self *)&stack0xffffffffffffff48);
    if (!bVar1) break;
    in_stack_ffffffffffffff40 =
         std::
         _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::PointCloudQuantity,_std::default_delete<polyscope::PointCloudQuantity>_>_>_>
         ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::PointCloudQuantity,_std::default_delete<polyscope::PointCloudQuantity>_>_>_>
                      *)0x3907a6);
    pPVar2 = std::
             unique_ptr<polyscope::PointCloudQuantity,_std::default_delete<polyscope::PointCloudQuantity>_>
             ::operator->((unique_ptr<polyscope::PointCloudQuantity,_std::default_delete<polyscope::PointCloudQuantity>_>
                           *)0x3907b9);
    (*(pPVar2->super_Quantity<polyscope::PointCloud>)._vptr_Quantity[5])(pPVar2,local_10);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::PointCloudQuantity,_std::default_delete<polyscope::PointCloudQuantity>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::PointCloudQuantity,_std::default_delete<polyscope::PointCloudQuantity>_>_>_>
                  *)in_RDI);
  }
  ImGui::Indent(indent_w);
  return;
}

Assistant:

void PointCloud::buildPickUI(size_t localPickID) {

  ImGui::TextUnformatted(("#" + std::to_string(localPickID) + "  ").c_str());
  ImGui::SameLine();
  ImGui::TextUnformatted(to_string(points[localPickID]).c_str());

  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Indent(20.);

  // Build GUI to show the quantities
  ImGui::Columns(2);
  ImGui::SetColumnWidth(0, ImGui::GetWindowWidth() / 3);
  for (auto& x : quantities) {
    x.second->buildPickUI(localPickID);
  }

  ImGui::Indent(-20.);
}